

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_typename.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb::Transformer::TransformTypeNameInternal
          (LogicalType *__return_storage_ptr__,Transformer *this,PGTypeName *type_name)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uchar width;
  uchar scale;
  PGValue *pPVar4;
  reference pvVar5;
  PGAConst *pPVar6;
  PGList *pPVar7;
  iterator iVar8;
  PGTypeName *pPVar9;
  unsigned_long uVar10;
  ParserException *pPVar11;
  PGList *pPVar12;
  string *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_01;
  ulong uVar13;
  undefined8 *puVar14;
  ulong val;
  ulong val_00;
  ulong uVar15;
  string_t sVar16;
  LogicalTypeId LStack_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  case_insensitive_set_t name_collision_set;
  vector<duckdb::Value,_true> type_mods;
  child_list_t<LogicalType> children;
  optional_ptr<duckdb_libpgquery::PGTypeName,_true> entry_type_node;
  optional_ptr<duckdb_libpgquery::PGValue,_true> entry_name_node;
  LogicalType entry_type;
  child_list_t<LogicalType> local_228;
  LogicalType local_210;
  child_list_t<LogicalType> local_1f8;
  vector<duckdb::Value,_true> local_1d8;
  vector<duckdb::Value,_true> local_1b8;
  LogicalType local_1a0;
  LogicalType local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pPVar12 = type_name->names;
  if (1 < pPVar12->length) {
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while (pPVar12 = (PGList *)pPVar12->head, pPVar12 != (PGList *)0x0) {
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)pPVar12;
      pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                         ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&type_mods);
      ::std::__cxx11::string::string
                ((string *)&name_collision_set,(pPVar4->val).str,(allocator *)&children);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_collision_set);
      ::std::__cxx11::string::~string((string *)&name_collision_set);
    }
    TransformTypeModifiers(&type_mods,this,type_name);
    iVar1 = type_name->names->length;
    if (iVar1 == 2) {
      ::std::__cxx11::string::string
                ((string *)&local_110,anon_var_dwarf_4b71df5 + 9,(allocator *)&name_collision_set);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&names,0);
      ::std::__cxx11::string::string((string *)&local_130,(string *)pvVar5);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&names,1);
      ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar5);
      local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogicalType::USER(__return_storage_ptr__,&local_110,&local_130,&local_50,&local_1b8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_130);
      this_00 = &local_110;
    }
    else {
      if (iVar1 != 3) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,
                   "Too many qualifications for type name - expected [catalog.schema.name] or [schema.name]"
                   ,(allocator *)&children);
        ParserException::ParserException(pPVar11,(string *)&name_collision_set);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&names,0);
      ::std::__cxx11::string::string((string *)&local_150,(string *)pvVar5);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&names,1);
      ::std::__cxx11::string::string((string *)&local_170,(string *)pvVar5);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&names,2);
      ::std::__cxx11::string::string((string *)&local_70,(string *)pvVar5);
      local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogicalType::USER(__return_storage_ptr__,&local_150,&local_170,&local_70,&local_1d8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_170);
      this_00 = &local_150;
    }
    ::std::__cxx11::string::~string((string *)this_00);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&type_mods);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&names);
    return __return_storage_ptr__;
  }
  name_collision_set._M_h._M_buckets = (__buckets_ptr)(pPVar12->tail->data).ptr_value;
  pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                     ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&name_collision_set);
  pcVar2 = (pPVar4->val).str;
  ::std::__cxx11::string::string((string *)&name_collision_set,pcVar2,(allocator *)&names);
  LStack_350 = TransformStringToLogicalTypeId((string *)&name_collision_set);
  ::std::__cxx11::string::~string((string *)&name_collision_set);
  switch(LStack_350) {
  case STRUCT:
    pPVar12 = type_name->typmods;
    if ((pPVar12 == (PGList *)0x0) || (pPVar12->length == 0)) {
      pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name_collision_set,"Struct needs a name and entries",(allocator *)&names
                );
      ParserException::ParserException(pPVar11,(string *)&name_collision_set);
      __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name_collision_set._M_h._M_buckets = &name_collision_set._M_h._M_single_bucket;
    name_collision_set._M_h._M_bucket_count = 1;
    name_collision_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    name_collision_set._M_h._M_element_count = 0;
    name_collision_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    name_collision_set._M_h._M_rehash_policy._M_next_resize = 0;
    name_collision_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while (pPVar12 = (PGList *)pPVar12->head, pPVar12 != (PGList *)0x0) {
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)pPVar12;
      pPVar7 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&names);
      if (pPVar7->length != 2) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&names,"Struct entry needs an entry name and a type name",
                   (allocator *)&type_mods);
        ParserException::ParserException(pPVar11,(string *)&names);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      entry_name_node.ptr = *(PGValue **)&pPVar7->head->data;
      entry_type_node.ptr = *(PGTypeName **)&pPVar7->tail->data;
      pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&entry_name_node);
      ::std::__cxx11::string::string((string *)&type_mods,(pPVar4->val).str,(allocator *)&names);
      iVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&name_collision_set._M_h,(key_type *)&type_mods);
      if (iVar8.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&names,"Duplicate struct entry name \"%s\"",(allocator *)&entry_type);
        ::std::__cxx11::string::string((string *)&local_90,(string *)&type_mods);
        ParserException::ParserException<std::__cxx11::string>(pPVar11,(string *)&names,&local_90);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&name_collision_set._M_h,(key_type *)&type_mods);
      pPVar9 = optional_ptr<duckdb_libpgquery::PGTypeName,_true>::operator*(&entry_type_node);
      TransformTypeName(&entry_type,this,pPVar9);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&names,(key_type *)&type_mods,&entry_type);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&children,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&names);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&names);
      LogicalType::~LogicalType(&entry_type);
      ::std::__cxx11::string::~string((string *)&type_mods);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_228,
             &children.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            );
    LogicalType::STRUCT(__return_storage_ptr__,&local_228);
    this_01 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_228;
    break;
  case LIST:
    pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&name_collision_set,"LIST is not valid as a stand-alone type",
               (allocator *)&names);
    ParserException::ParserException(pPVar11,(string *)&name_collision_set);
    __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  case MAP:
    pPVar12 = type_name->typmods;
    if ((pPVar12 != (PGList *)0x0) && (pPVar12->length == 2)) {
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(pPVar12->head->data).ptr_value;
      pPVar9 = optional_ptr<duckdb_libpgquery::PGTypeName,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGTypeName,_true> *)&names);
      TransformTypeName((LogicalType *)&name_collision_set,this,pPVar9);
      type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(type_name->typmods->tail->data).ptr_value;
      pPVar9 = optional_ptr<duckdb_libpgquery::PGTypeName,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGTypeName,_true> *)&type_mods);
      TransformTypeName((LogicalType *)&names,this,pPVar9);
      LogicalType::LogicalType(&local_188,(LogicalType *)&name_collision_set);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)&names);
      LogicalType::MAP(__return_storage_ptr__,&local_188,&local_1a0);
      LogicalType::~LogicalType(&local_1a0);
      LogicalType::~LogicalType(&local_188);
      LogicalType::~LogicalType((LogicalType *)&names);
      LogicalType::~LogicalType((LogicalType *)&name_collision_set);
      return __return_storage_ptr__;
    }
    pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&name_collision_set,
               "Map type needs exactly two entries, key and value type",(allocator *)&names);
    ParserException::ParserException(pPVar11,(string *)&name_collision_set);
    __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  case ENUM:
    if ((type_name->typmods != (PGList *)0x0) && (type_name->typmods->length != 0)) {
      LogicalType::LogicalType(&local_210,VARCHAR);
      uVar10 = NumericCastImpl<unsigned_long,_int,_false>::Convert(type_name->typmods->length);
      Vector::Vector((Vector *)&name_collision_set,&local_210,uVar10);
      LogicalType::~LogicalType(&local_210);
      pPVar12 = type_name->typmods;
      puVar14 = (undefined8 *)
                (CONCAT44(name_collision_set._M_h._M_rehash_policy._4_4_,
                          name_collision_set._M_h._M_rehash_policy._M_max_load_factor) + 8);
      while( true ) {
        pPVar12 = (PGList *)pPVar12->head;
        if (pPVar12 == (PGList *)0x0) {
          uVar10 = NumericCastImpl<unsigned_long,_int,_false>::Convert(type_name->typmods->length);
          LogicalType::ENUM(__return_storage_ptr__,(Vector *)&name_collision_set,uVar10);
          Vector::~Vector((Vector *)&name_collision_set);
          return __return_storage_ptr__;
        }
        type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)pPVar12;
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&type_mods);
        if ((pPVar6->type != T_PGAConst) ||
           (pPVar6 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator->
                               ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&type_mods),
           (pPVar6->val).type != T_PGString)) break;
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&type_mods);
        sVar16 = StringVector::AddString((Vector *)&name_collision_set,(pPVar6->val).val.str);
        puVar14[-1] = sVar16.value._0_8_;
        *puVar14 = sVar16.value._8_8_;
        puVar14 = puVar14 + 2;
      }
      pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&names,"Enum type requires a set of strings as type modifiers",
                 (allocator *)&children);
      ParserException::ParserException(pPVar11,(string *)&names);
      __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&name_collision_set,"Enum needs a set of entries",(allocator *)&names);
    ParserException::ParserException(pPVar11,(string *)&name_collision_set);
    __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  case UNION:
    pPVar12 = type_name->typmods;
    if ((pPVar12 == (PGList *)0x0) || (pPVar12->length == 0)) {
      pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name_collision_set,"Union type needs at least one member",
                 (allocator *)&names);
      ParserException::ParserException(pPVar11,(string *)&name_collision_set);
      __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0x100 < pPVar12->length) {
      pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name_collision_set,"Union types can have at most %d members",
                 (allocator *)&names);
      ParserException::ParserException<unsigned_long>(pPVar11,(string *)&name_collision_set,0x100);
      __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name_collision_set._M_h._M_buckets = &name_collision_set._M_h._M_single_bucket;
    name_collision_set._M_h._M_bucket_count = 1;
    name_collision_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    name_collision_set._M_h._M_element_count = 0;
    name_collision_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    name_collision_set._M_h._M_rehash_policy._M_next_resize = 0;
    name_collision_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while (pPVar12 = (PGList *)pPVar12->head, pPVar12 != (PGList *)0x0) {
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)pPVar12;
      pPVar7 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&names);
      if (pPVar7->length != 2) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&names,"Union type member needs a tag name and a type name",
                   (allocator *)&type_mods);
        ParserException::ParserException(pPVar11,(string *)&names);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      entry_name_node.ptr = *(PGValue **)&pPVar7->head->data;
      entry_type_node.ptr = *(PGTypeName **)&pPVar7->tail->data;
      pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&entry_name_node);
      ::std::__cxx11::string::string((string *)&type_mods,(pPVar4->val).str,(allocator *)&names);
      iVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&name_collision_set._M_h,(key_type *)&type_mods);
      if (iVar8.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&names,"Duplicate union type tag name \"%s\"",(allocator *)&entry_type)
        ;
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&type_mods);
        ParserException::ParserException<std::__cxx11::string>(pPVar11,(string *)&names,&local_b0);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&name_collision_set._M_h,(key_type *)&type_mods);
      pPVar9 = optional_ptr<duckdb_libpgquery::PGTypeName,_true>::operator*(&entry_type_node);
      TransformTypeName(&entry_type,this,pPVar9);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&names,(key_type *)&type_mods,&entry_type);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&children,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&names);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&names);
      LogicalType::~LogicalType(&entry_type);
      ::std::__cxx11::string::~string((string *)&type_mods);
    }
    local_1f8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         children.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1f8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         children.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         children.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalType::UNION(__return_storage_ptr__,&local_1f8);
    this_01 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_1f8;
    break;
  default:
    if (LStack_350 == USER) {
      ::std::__cxx11::string::string((string *)&name_collision_set,pcVar2,(allocator *)&names);
      TransformTypeModifiers((vector<duckdb::Value,_true> *)&names,this,type_name);
      LogicalType::USER(__return_storage_ptr__,(string *)&name_collision_set,
                        (vector<duckdb::Value,_true> *)&names);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&names);
      ::std::__cxx11::string::~string((string *)&name_collision_set);
      return __return_storage_ptr__;
    }
  case TABLE:
  case AGGREGATE_STATE:
  case LAMBDA:
    uVar13 = 0;
    val = 0x12;
    if (LStack_350 != DECIMAL) {
      val = uVar13;
    }
    val_00 = (ulong)(LStack_350 == DECIMAL) * 3;
    pPVar12 = type_name->typmods;
    if (pPVar12 != (PGList *)0x0) {
      uVar13 = 0;
      while (pPVar12 = (PGList *)pPVar12->head, pPVar12 != (PGList *)0x0) {
        name_collision_set._M_h._M_buckets = *(__buckets_ptr *)pPVar12;
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator*
                           ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&name_collision_set);
        if ((pPVar6->type != T_PGAConst) || ((pPVar6->val).type != T_PGInteger)) {
          pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&name_collision_set,"Expected an integer constant as type modifier",
                     (allocator *)&names);
          ParserException::ParserException(pPVar11,(string *)&name_collision_set);
          __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar3 = (pPVar6->val).val.ival;
        if ((long)uVar3 < 0) {
          pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&name_collision_set,"Negative modifier not supported",
                     (allocator *)&names);
          ParserException::ParserException(pPVar11,(string *)&name_collision_set);
          __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar15 = uVar3;
        if (uVar13 != 1) {
          if (uVar13 != 0) {
            pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&name_collision_set,"A maximum of two modifiers is supported",
                       (allocator *)&names);
            ParserException::ParserException(pPVar11,(string *)&name_collision_set);
            __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          val = uVar3;
          if (pPVar6->location != -1) {
            val = 0;
          }
          uVar15 = val_00;
          if (LStack_350 != BIT) {
            val = uVar3;
          }
        }
        uVar13 = uVar13 + 1;
        val_00 = uVar15;
      }
    }
    switch(LStack_350) {
    case TIMESTAMP:
      if (uVar13 == 1) {
        if (10 < (long)val) {
          pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&name_collision_set,
                     "TIMESTAMP only supports until nano-second precision (9)",(allocator *)&names);
          ParserException::ParserException(pPVar11,(string *)&name_collision_set);
          __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (val == 0) {
          LStack_350 = TIMESTAMP_SEC;
          break;
        }
        if ((long)val < 4) {
          LStack_350 = TIMESTAMP_MS;
          break;
        }
        if (6 < val) {
          LStack_350 = TIMESTAMP_NS;
          break;
        }
      }
      else if (uVar13 != 0) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,"TIMESTAMP only supports a single modifier",
                   (allocator *)&names);
        ParserException::ParserException(pPVar11,(string *)&name_collision_set);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LStack_350 = TIMESTAMP;
      break;
    case DECIMAL:
      if (uVar13 == 1) {
        val_00 = 0;
      }
      if (0xffffffffffffffd9 < val - 0x27) {
        if ((long)val_00 <= (long)val) {
          width = NumericCastImpl<unsigned_char,_long,_false>::Convert(val);
          scale = NumericCastImpl<unsigned_char,_long,_false>::Convert(val_00);
          LogicalType::DECIMAL(__return_storage_ptr__,width,scale);
          return __return_storage_ptr__;
        }
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,"Scale cannot be bigger than width",
                   (allocator *)&names);
        ParserException::ParserException(pPVar11,(string *)&name_collision_set);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name_collision_set,"Width must be between 1 and %d!",(allocator *)&names
                );
      ParserException::ParserException<int>(pPVar11,(string *)&name_collision_set,0x26);
      __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    case VARCHAR:
      if (1 < uVar13) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,"VARCHAR only supports a single modifier",
                   (allocator *)&names);
        ParserException::ParserException(pPVar11,(string *)&name_collision_set);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LStack_350 = VARCHAR;
      break;
    case INTERVAL:
      if (1 < uVar13) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,"INTERVAL only supports a single modifier",
                   (allocator *)&names);
        ParserException::ParserException(pPVar11,(string *)&name_collision_set);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LStack_350 = INTERVAL;
      break;
    default:
      if (LStack_350 == BIT) {
        if ((val == 0) && (type_name->typmods != (PGList *)0x0)) {
          pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&name_collision_set,"Type %s does not support any modifiers!",
                     (allocator *)&type_mods);
          LogicalType::LogicalType((LogicalType *)&names,BIT);
          LogicalType::ToString_abi_cxx11_(&local_d0,(LogicalType *)&names);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar11,(string *)&name_collision_set,&local_d0);
          __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LStack_350 = BIT;
        break;
      }
    case TIMESTAMP_NS:
    case FLOAT:
    case DOUBLE:
    case CHAR:
    case BLOB:
      if (uVar13 != 0) {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&name_collision_set,"Type %s does not support any modifiers!",
                   (allocator *)&type_mods);
        LogicalType::LogicalType((LogicalType *)&names,LStack_350);
        LogicalType::ToString_abi_cxx11_(&local_f0,(LogicalType *)&names);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar11,(string *)&name_collision_set,&local_f0);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    LogicalType::LogicalType(__return_storage_ptr__,LStack_350);
    return __return_storage_ptr__;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(this_01);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&name_collision_set._M_h);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&children);
  return __return_storage_ptr__;
}

Assistant:

LogicalType Transformer::TransformTypeNameInternal(duckdb_libpgquery::PGTypeName &type_name) {
	if (type_name.names->length > 1) {
		// qualified typename
		vector<string> names;
		for (auto cell = type_name.names->head; cell; cell = cell->next) {
			names.push_back(PGPointerCast<duckdb_libpgquery::PGValue>(cell->data.ptr_value)->val.str);
		}
		vector<Value> type_mods = TransformTypeModifiers(type_name);
		switch (type_name.names->length) {
		case 2: {
			return LogicalType::USER(INVALID_CATALOG, std::move(names[0]), std::move(names[1]), std::move(type_mods));
		}
		case 3: {
			return LogicalType::USER(std::move(names[0]), std::move(names[1]), std::move(names[2]),
			                         std::move(type_mods));
		}
		default:
			throw ParserException(
			    "Too many qualifications for type name - expected [catalog.schema.name] or [schema.name]");
		}
	}

	auto name = PGPointerCast<duckdb_libpgquery::PGValue>(type_name.names->tail->data.ptr_value)->val.str;
	// transform it to the SQL type
	LogicalTypeId base_type = TransformStringToLogicalTypeId(name);

	if (base_type == LogicalTypeId::LIST) {
		throw ParserException("LIST is not valid as a stand-alone type");
	}
	if (base_type == LogicalTypeId::ENUM) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Enum needs a set of entries");
		}
		Vector enum_vector(LogicalType::VARCHAR, NumericCast<idx_t>(type_name.typmods->length));
		auto string_data = FlatVector::GetData<string_t>(enum_vector);
		idx_t pos = 0;
		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto constant_value = PGPointerCast<duckdb_libpgquery::PGAConst>(node->data.ptr_value);
			if (constant_value->type != duckdb_libpgquery::T_PGAConst ||
			    constant_value->val.type != duckdb_libpgquery::T_PGString) {
				throw ParserException("Enum type requires a set of strings as type modifiers");
			}
			string_data[pos++] = StringVector::AddString(enum_vector, constant_value->val.val.str);
		}
		return LogicalType::ENUM(enum_vector, NumericCast<idx_t>(type_name.typmods->length));
	}
	if (base_type == LogicalTypeId::STRUCT) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Struct needs a name and entries");
		}
		child_list_t<LogicalType> children;
		case_insensitive_set_t name_collision_set;

		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto &type_val = *PGPointerCast<duckdb_libpgquery::PGList>(node->data.ptr_value);
			if (type_val.length != 2) {
				throw ParserException("Struct entry needs an entry name and a type name");
			}

			auto entry_name_node = PGPointerCast<duckdb_libpgquery::PGValue>(type_val.head->data.ptr_value);
			D_ASSERT(entry_name_node->type == duckdb_libpgquery::T_PGString);
			auto entry_type_node = PGPointerCast<duckdb_libpgquery::PGTypeName>(type_val.tail->data.ptr_value);
			D_ASSERT(entry_type_node->type == duckdb_libpgquery::T_PGTypeName);

			auto entry_name = string(entry_name_node->val.str);
			D_ASSERT(!entry_name.empty());

			if (name_collision_set.find(entry_name) != name_collision_set.end()) {
				throw ParserException("Duplicate struct entry name \"%s\"", entry_name);
			}
			name_collision_set.insert(entry_name);
			auto entry_type = TransformTypeName(*entry_type_node);

			children.push_back(make_pair(entry_name, entry_type));
		}
		D_ASSERT(!children.empty());
		return LogicalType::STRUCT(children);
	}
	if (base_type == LogicalTypeId::MAP) {
		if (!type_name.typmods || type_name.typmods->length != 2) {
			throw ParserException("Map type needs exactly two entries, key and value type");
		}
		auto key_type =
		    TransformTypeName(*PGPointerCast<duckdb_libpgquery::PGTypeName>(type_name.typmods->head->data.ptr_value));
		auto value_type =
		    TransformTypeName(*PGPointerCast<duckdb_libpgquery::PGTypeName>(type_name.typmods->tail->data.ptr_value));

		return LogicalType::MAP(std::move(key_type), std::move(value_type));
	}
	if (base_type == LogicalTypeId::UNION) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Union type needs at least one member");
		}
		if (type_name.typmods->length > (int)UnionType::MAX_UNION_MEMBERS) {
			throw ParserException("Union types can have at most %d members", UnionType::MAX_UNION_MEMBERS);
		}

		child_list_t<LogicalType> children;
		case_insensitive_set_t name_collision_set;

		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto &type_val = *PGPointerCast<duckdb_libpgquery::PGList>(node->data.ptr_value);
			if (type_val.length != 2) {
				throw ParserException("Union type member needs a tag name and a type name");
			}

			auto entry_name_node = PGPointerCast<duckdb_libpgquery::PGValue>(type_val.head->data.ptr_value);
			D_ASSERT(entry_name_node->type == duckdb_libpgquery::T_PGString);
			auto entry_type_node = PGPointerCast<duckdb_libpgquery::PGTypeName>(type_val.tail->data.ptr_value);
			D_ASSERT(entry_type_node->type == duckdb_libpgquery::T_PGTypeName);

			auto entry_name = string(entry_name_node->val.str);
			D_ASSERT(!entry_name.empty());

			if (name_collision_set.find(entry_name) != name_collision_set.end()) {
				throw ParserException("Duplicate union type tag name \"%s\"", entry_name);
			}

			name_collision_set.insert(entry_name);

			auto entry_type = TransformTypeName(*entry_type_node);
			children.push_back(make_pair(entry_name, entry_type));
		}
		D_ASSERT(!children.empty());
		return LogicalType::UNION(std::move(children));
	}
	if (base_type == LogicalTypeId::USER) {
		string user_type_name {name};
		vector<Value> type_mods = TransformTypeModifiers(type_name);
		return LogicalType::USER(user_type_name, type_mods);
	}

	SizeModifiers modifiers = GetSizeModifiers(type_name, base_type);
	switch (base_type) {
	case LogicalTypeId::VARCHAR:
		if (modifiers.count > 1) {
			throw ParserException("VARCHAR only supports a single modifier");
		}
		// FIXME: create CHECK constraint based on varchar width
		modifiers.width = 0;
		return LogicalType::VARCHAR;
	case LogicalTypeId::DECIMAL:
		if (modifiers.count > 2) {
			throw ParserException("DECIMAL only supports a maximum of two modifiers");
		}
		if (modifiers.count == 1) {
			// only width is provided: set scale to 0
			modifiers.scale = 0;
		}
		if (modifiers.width <= 0 || modifiers.width > Decimal::MAX_WIDTH_DECIMAL) {
			throw ParserException("Width must be between 1 and %d!", (int)Decimal::MAX_WIDTH_DECIMAL);
		}
		if (modifiers.scale > modifiers.width) {
			throw ParserException("Scale cannot be bigger than width");
		}
		return LogicalType::DECIMAL(NumericCast<uint8_t>(modifiers.width), NumericCast<uint8_t>(modifiers.scale));
	case LogicalTypeId::INTERVAL:
		if (modifiers.count > 1) {
			throw ParserException("INTERVAL only supports a single modifier");
		}
		modifiers.width = 0;
		return LogicalType::INTERVAL;
	case LogicalTypeId::BIT:
		if (!modifiers.width && type_name.typmods) {
			throw ParserException("Type %s does not support any modifiers!", LogicalType(base_type).ToString());
		}
		return LogicalType(base_type);
	case LogicalTypeId::TIMESTAMP:
		if (modifiers.count == 0) {
			return LogicalType::TIMESTAMP;
		}
		if (modifiers.count > 1) {
			throw ParserException("TIMESTAMP only supports a single modifier");
		}
		if (modifiers.width > 10) {
			throw ParserException("TIMESTAMP only supports until nano-second precision (9)");
		}
		if (modifiers.width == 0) {
			return LogicalType::TIMESTAMP_S;
		}
		if (modifiers.width <= 3) {
			return LogicalType::TIMESTAMP_MS;
		}
		if (modifiers.width <= 6) {
			return LogicalType::TIMESTAMP;
		}
		return LogicalType::TIMESTAMP_NS;
	default:
		if (modifiers.count > 0) {
			throw ParserException("Type %s does not support any modifiers!", LogicalType(base_type).ToString());
		}
		return LogicalType(base_type);
	}
}